

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O1

void vkt::shaderexecutor::generateSources
               (ShaderType shaderType,ShaderSpec *shaderSpec,SourceCollections *dst)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_type sVar2;
  char cVar3;
  int iVar4;
  DataType DVar5;
  istream *piVar6;
  ProgramSources *pPVar7;
  ostream *poVar8;
  char *pcVar9;
  size_t sVar10;
  InternalError *this;
  uint *inputPrefix;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *inputs;
  vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_> *inputs_00;
  int ndx;
  int iVar11;
  pointer pSVar12;
  pointer ppSVar13;
  ulong uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  string *in_R8;
  string *in_R9;
  VarType *pVVar16;
  string line;
  FragmentOutputLayout outputLayout;
  istringstream opSrc;
  ostringstream src;
  VarType intType;
  undefined1 local_460 [32];
  ProgramSources *local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  undefined1 local_418 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  string local_3f0;
  undefined1 local_3d0 [32];
  undefined1 local_3b0 [24];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_398;
  long *local_368;
  long local_360;
  long local_358 [2];
  undefined1 local_348 [16];
  undefined1 local_338 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [4];
  ios_base local_2d8 [8];
  ios_base local_2d0 [264];
  ProgramSources *local_1c8;
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0 [6];
  ios_base local_150 [264];
  VarType local_48;
  
  inputPrefix = &switchD_00825035::switchdataD_00b57414;
  local_440 = (ProgramSources *)dst;
  switch(shaderType) {
  case SHADERTYPE_VERTEX:
    anon_unknown_0::computeFragmentOutputLayout
              ((FragmentOutputLayout *)local_3b0,&shaderSpec->outputs);
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    local_3f0.field_2._M_allocated_capacity._0_2_ = 0x6576;
    local_3f0.field_2._M_local_buf[2] = 'r';
    local_3f0.field_2._M_local_buf[3] = 't';
    local_3f0._M_string_length = 4;
    local_3f0.field_2._M_allocated_capacity._4_4_ =
         local_3f0.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    local_1c8 = ::vk::ProgramCollection<glu::ProgramSources>::add
                          ((ProgramCollection<glu::ProgramSources> *)local_440,&local_3f0);
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    local_438._M_string_length = 2;
    local_438.field_2._M_allocated_capacity._0_3_ = 0x5f61;
    local_3d0._0_8_ = local_3d0 + 0x10;
    local_3d0._16_8_ = 0x5f74756f5f787476;
    local_3d0._8_8_ = 8;
    local_3d0._24_2_ = (ushort)(byte)local_3d0[0x19] << 8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"#version 310 es\n",0x10);
    sVar2 = (shaderSpec->globalDeclarations)._M_string_length;
    if (sVar2 != 0) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(shaderSpec->globalDeclarations)._M_dataplus._M_p,
                          sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
    pSVar12 = (shaderSpec->inputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar12 !=
        (shaderSpec->inputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar11 = 1;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,"layout(location = ",0x12);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,iVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") in ",5);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_460,&local_438,&pSVar12->name);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_348,&pSVar12->varType,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,0)
        ;
        poVar8 = glu::decl::operator<<(poVar8,(DeclareVariable *)local_348);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_allocated_capacity != local_320) {
          operator_delete((void *)local_330._M_allocated_capacity,
                          local_320[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_348);
        if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
          operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
        }
        iVar11 = iVar11 + 1;
        pSVar12 = pSVar12 + 1;
      } while (pSVar12 !=
               (shaderSpec->inputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pSVar12 = (shaderSpec->outputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar12 !=
        (shaderSpec->outputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar11 = 0;
      pVVar16 = &pSVar12->varType;
      do {
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&pVVar16[-2].m_data + 8);
        DVar5 = (pVVar16->m_data).basic.type;
        if (DVar5 - TYPE_BOOL < 4) {
          iVar4 = glu::getDataTypeScalarSize(DVar5);
          DVar5 = TYPE_INT;
          if (1 < iVar4) {
            DVar5 = glu::getDataTypeIntVec(iVar4);
          }
          glu::VarType::VarType(&local_48,DVar5,PRECISION_HIGHP);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,"layout(location = ",0x12);
          poVar8 = (ostream *)std::ostream::operator<<(local_1c0,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") flat out ",0xb);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_460,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3d0,pbVar1);
          glu::decl::DeclareVariable::DeclareVariable
                    ((DeclareVariable *)local_348,&local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                     0);
          poVar8 = glu::decl::operator<<(poVar8,(DeclareVariable *)local_348);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_allocated_capacity != local_320) {
            operator_delete((void *)local_330._M_allocated_capacity,
                            local_320[0]._M_allocated_capacity + 1);
          }
          glu::VarType::~VarType((VarType *)local_348);
          if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
            operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
          }
          glu::VarType::~VarType(&local_48);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,"layout(location = ",0x12);
          poVar8 = (ostream *)std::ostream::operator<<(local_1c0,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") flat out ",0xb);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_460,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3d0,pbVar1);
          glu::decl::DeclareVariable::DeclareVariable
                    ((DeclareVariable *)local_348,pVVar16,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                     0);
          poVar8 = glu::decl::operator<<(poVar8,(DeclareVariable *)local_348);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_allocated_capacity != local_320) {
            operator_delete((void *)local_330._M_allocated_capacity,
                            local_320[0]._M_allocated_capacity + 1);
          }
          glu::VarType::~VarType((VarType *)local_348);
          if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
            operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
          }
        }
        iVar11 = iVar11 + 1;
        pSVar12 = (pointer)(pVVar16 + 1);
        pVVar16 = (VarType *)&pVVar16[2].m_data;
      } while (pSVar12 !=
               (shaderSpec->outputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"\tgl_Position = a_position;\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"\tgl_PointSize = 1.0;\n",0x15);
    pSVar12 = (shaderSpec->inputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar12 !=
        (shaderSpec->inputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_348,&pSVar12->varType,&pSVar12->name,0);
        poVar8 = glu::decl::operator<<((ostream *)local_1c0,(DeclareVariable *)local_348);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_438._M_dataplus._M_p,local_438._M_string_length);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(pSVar12->name)._M_dataplus._M_p,(pSVar12->name)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_allocated_capacity != local_320) {
          operator_delete((void *)local_330._M_allocated_capacity,
                          local_320[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_348);
        pSVar12 = pSVar12 + 1;
      } while (pSVar12 !=
               (shaderSpec->inputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pSVar12 = (shaderSpec->outputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar12 !=
        (shaderSpec->outputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_348,&pSVar12->varType,&pSVar12->name,0);
        poVar8 = glu::decl::operator<<((ostream *)local_1c0,(DeclareVariable *)local_348);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_allocated_capacity != local_320) {
          operator_delete((void *)local_330._M_allocated_capacity,
                          local_320[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_348);
        pSVar12 = pSVar12 + 1;
      } while (pSVar12 !=
               (shaderSpec->outputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_348,(string *)&shaderSpec->source,_S_in);
    local_460._0_8_ = local_460 + 0x10;
    local_460._8_8_ = 0;
    local_460._16_8_ = local_460._16_8_ & 0xffffffffffffff00;
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_348._0_8_ + -0x18) +
                              (char)(istringstream *)local_348);
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_348,(string *)local_460,cVar3);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(char *)local_460._0_8_,local_460._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    }
    if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
      operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_348);
    std::ios_base::~ios_base(local_2d0);
    pSVar12 = (shaderSpec->outputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar12 !=
        (shaderSpec->outputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        DVar5 = (pSVar12->varType).m_data.basic.type;
        if (DVar5 - TYPE_BOOL < 4) {
          iVar11 = glu::getDataTypeScalarSize(DVar5);
          DVar5 = TYPE_INT;
          if (1 < iVar11) {
            DVar5 = glu::getDataTypeIntVec(iVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1c0,(char *)local_3d0._0_8_,local_3d0._8_8_);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(pSVar12->name)._M_dataplus._M_p,
                              (pSVar12->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
          pcVar9 = glu::getDataTypeName(DVar5);
          if (pcVar9 == (char *)0x0) {
            std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
          }
          else {
            sVar10 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(pSVar12->name)._M_dataplus._M_p,
                              (pSVar12->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,");\n",3);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1c0,(char *)local_3d0._0_8_,local_3d0._8_8_);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(pSVar12->name)._M_dataplus._M_p,
                              (pSVar12->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(pSVar12->name)._M_dataplus._M_p,
                              (pSVar12->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
        }
        pSVar12 = pSVar12 + 1;
      } while (pSVar12 !=
               (shaderSpec->outputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base(local_150);
    local_418._0_4_ = 0;
    local_418._8_8_ = local_408._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_418 + 8),local_368,local_360 + (long)local_368);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_1c8->sources + (uint)local_418._0_4_,(value_type *)(local_418 + 8));
    if ((char *)local_418._8_8_ != local_408._M_local_buf + 8) {
      operator_delete((void *)local_418._8_8_,local_408._8_8_ + 1);
    }
    if (local_368 != local_358) {
      operator_delete(local_368,local_358[0] + 1);
    }
    if ((undefined1 *)local_3d0._0_8_ != local_3d0 + 0x10) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,
                      CONCAT44(local_3f0.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_3f0.field_2._M_local_buf[3],
                                        CONCAT12(local_3f0.field_2._M_local_buf[2],
                                                 local_3f0.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    local_1b0[0]._M_allocated_capacity._0_4_ = 0x67617266;
    local_1c0._8_8_ = (char *)0x4;
    local_1b0[0]._M_allocated_capacity._4_4_ = local_1b0[0]._M_allocated_capacity._4_4_ & 0xffffff00
    ;
    local_1c0._0_8_ = local_1b0;
    pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_1c0);
    local_460._0_8_ = local_460 + 0x10;
    local_460._16_8_ = 0x5f74756f5f787476;
    local_460._8_8_ = 8;
    local_460._24_2_ = (ushort)(byte)local_460[0x19] << 8;
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    local_3f0.field_2._M_allocated_capacity._0_2_ = 0x5f6f;
    local_3f0._M_string_length = 2;
    local_3f0.field_2._M_local_buf[2] = '\0';
    anon_unknown_0::generatePassthroughFragmentShader
              ((string *)local_418,shaderSpec,SUB81(&local_398,0),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)local_460,&local_3f0,in_R9);
    local_348._0_4_ = 1;
    local_348._8_8_ = &local_330;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_348 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar7->sources + (local_348._0_8_ & 0xffffffff),(value_type *)(local_348 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._8_8_ != &local_330) {
      operator_delete((void *)local_348._8_8_,(ulong)(local_330._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,
                      CONCAT44(local_3f0.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_3f0.field_2._M_local_buf[3],
                                        CONCAT12(local_3f0.field_2._M_local_buf[2],
                                                 local_3f0.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
      operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != local_1b0) {
LAB_008278d2:
      operator_delete((void *)local_1c0._0_8_,
                      CONCAT44(local_1b0[0]._M_allocated_capacity._4_4_,
                               (undefined4)local_1b0[0]._M_allocated_capacity) + 1);
    }
    break;
  case SHADERTYPE_FRAGMENT:
    anon_unknown_0::computeFragmentOutputLayout
              ((FragmentOutputLayout *)local_3b0,&shaderSpec->outputs);
    local_1b0[0]._M_allocated_capacity._0_4_ = 0x74726576;
    local_1c0._8_8_ = (char *)0x4;
    local_1b0[0]._M_allocated_capacity._4_4_ = local_1b0[0]._M_allocated_capacity._4_4_ & 0xffffff00
    ;
    local_1c0._0_8_ = local_1b0;
    pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_1c0);
    (anonymous_namespace)::generatePassthroughVertexShader_abi_cxx11_
              ((string *)local_418,(_anonymous_namespace_ *)shaderSpec,inputs_00,(char *)inputPrefix
               ,(char *)in_R8);
    local_348._0_8_ = (ulong)(uint)local_348._4_4_ << 0x20;
    local_348._8_8_ = &local_330;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_348 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar7->sources + (local_348._0_8_ & 0xffffffff),(value_type *)(local_348 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._8_8_ != &local_330) {
      operator_delete((void *)local_348._8_8_,(ulong)(local_330._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != local_1b0) {
      operator_delete((void *)local_1c0._0_8_,
                      CONCAT44(local_1b0[0]._M_allocated_capacity._4_4_,
                               (undefined4)local_1b0[0]._M_allocated_capacity) + 1);
    }
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    local_3f0.field_2._M_allocated_capacity._0_2_ = 0x7266;
    local_3f0.field_2._M_local_buf[2] = 'a';
    local_3f0.field_2._M_local_buf[3] = 'g';
    local_3f0._M_string_length = 4;
    local_3f0.field_2._M_allocated_capacity._4_4_ =
         local_3f0.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    local_440 = ::vk::ProgramCollection<glu::ProgramSources>::add
                          ((ProgramCollection<glu::ProgramSources> *)local_440,&local_3f0);
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    local_438.field_2._M_allocated_capacity = 0x5f74756f5f787476;
    local_438._M_string_length = 8;
    local_438.field_2._M_local_buf[8] = '\0';
    local_3d0._0_8_ = local_3d0 + 0x10;
    local_3d0._8_8_ = 2;
    local_3d0._16_3_ = 0x5f6f;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"#version 310 es\n",0x10);
    sVar2 = (shaderSpec->globalDeclarations)._M_string_length;
    if (sVar2 != 0) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(shaderSpec->globalDeclarations)._M_dataplus._M_p,
                          sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    }
    pSVar12 = (shaderSpec->inputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar12 !=
        (shaderSpec->inputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,"layout(location = ",0x12);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,iVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") flat in ",10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_460,&local_438,&pSVar12->name);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_348,&pSVar12->varType,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,0)
        ;
        poVar8 = glu::decl::operator<<(poVar8,(DeclareVariable *)local_348);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_allocated_capacity != local_320) {
          operator_delete((void *)local_330._M_allocated_capacity,
                          local_320[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_348);
        if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
          operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
        }
        iVar11 = iVar11 + 1;
        pSVar12 = pSVar12 + 1;
      } while (pSVar12 !=
               (shaderSpec->inputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    anon_unknown_0::generateFragShaderOutputDecl
              ((ostream *)local_1c0,shaderSpec,SUB81(&local_398,0),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)local_3d0,in_R8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"\nvoid main (void)\n{\n",0x14);
    pSVar12 = (shaderSpec->inputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar12 !=
        (shaderSpec->inputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_348,&pSVar12->varType,&pSVar12->name,0);
        poVar8 = glu::decl::operator<<((ostream *)local_1c0,(DeclareVariable *)local_348);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_438._M_dataplus._M_p,local_438._M_string_length);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(pSVar12->name)._M_dataplus._M_p,(pSVar12->name)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_allocated_capacity != local_320) {
          operator_delete((void *)local_330._M_allocated_capacity,
                          local_320[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_348);
        pSVar12 = pSVar12 + 1;
      } while (pSVar12 !=
               (shaderSpec->inputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pSVar12 = (shaderSpec->outputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar12 !=
        (shaderSpec->outputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_348,&pSVar12->varType,&pSVar12->name,0);
        poVar8 = glu::decl::operator<<((ostream *)local_1c0,(DeclareVariable *)local_348);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_allocated_capacity != local_320) {
          operator_delete((void *)local_330._M_allocated_capacity,
                          local_320[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_348);
        pSVar12 = pSVar12 + 1;
      } while (pSVar12 !=
               (shaderSpec->outputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_348,(string *)&shaderSpec->source,_S_in);
    local_460._8_8_ = 0;
    local_460._16_8_ = local_460._16_8_ & 0xffffffffffffff00;
    local_460._0_8_ = local_460 + 0x10;
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_348._0_8_ - 0x18) +
                              (char)(istringstream *)local_348);
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_348,(string *)local_460,cVar3);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(char *)local_460._0_8_,local_460._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    }
    if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
      operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_348);
    std::ios_base::~ios_base(local_2d0);
    local_348._8_4_ = TYPE_INVALID;
    local_348._12_4_ = PRECISION_LOWP;
    local_338[0] = 0;
    local_348._0_8_ = local_338;
    anon_unknown_0::generateFragShaderOutAssign
              ((ostream *)local_1c0,shaderSpec,SUB81(local_348,0),(string *)local_3d0,in_R8);
    if ((undefined1 *)local_348._0_8_ != local_338) {
      operator_delete((void *)local_348._0_8_,CONCAT71(local_338._1_7_,local_338[0]) + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base(local_150);
    local_418._0_4_ = 1;
    local_418._8_8_ = local_408._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_418 + 8),local_368,local_360 + (long)local_368);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_440->sources + (uint)local_418._0_4_,(value_type *)(local_418 + 8));
    if ((char *)local_418._8_8_ != local_408._M_local_buf + 8) {
      operator_delete((void *)local_418._8_8_,local_408._8_8_ + 1);
    }
    if (local_368 != local_358) {
      operator_delete(local_368,local_358[0] + 1);
    }
    if ((undefined1 *)local_3d0._0_8_ != local_3d0 + 0x10) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,
                      CONCAT44(local_3f0.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_3f0.field_2._M_local_buf[3],
                                        CONCAT12(local_3f0.field_2._M_local_buf[2],
                                                 local_3f0.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    break;
  case SHADERTYPE_GEOMETRY:
    anon_unknown_0::computeFragmentOutputLayout
              ((FragmentOutputLayout *)local_3b0,&shaderSpec->outputs);
    local_1c0._0_8_ = local_1b0;
    local_1b0[0]._M_allocated_capacity._0_4_ = 0x74726576;
    local_1c0._8_8_ = 4;
    local_1b0[0]._M_allocated_capacity._4_4_ = local_1b0[0]._M_allocated_capacity._4_4_ & 0xffffff00
    ;
    pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_1c0);
    (anonymous_namespace)::generatePassthroughVertexShader_abi_cxx11_
              ((string *)local_418,(_anonymous_namespace_ *)shaderSpec,inputs,(char *)inputPrefix,
               (char *)in_R8);
    local_348._0_8_ = (ulong)(uint)local_348._4_4_ << 0x20;
    local_348._8_8_ = &local_330;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_348 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar7->sources + (local_348._0_8_ & 0xffffffff),(value_type *)(local_348 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._8_8_ != &local_330) {
      operator_delete((void *)local_348._8_8_,(ulong)(local_330._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != local_1b0) {
      operator_delete((void *)local_1c0._0_8_,
                      CONCAT44(local_1b0[0]._M_allocated_capacity._4_4_,
                               (undefined4)local_1b0[0]._M_allocated_capacity) + 1);
    }
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    local_3f0.field_2._M_allocated_capacity._0_2_ = 0x6567;
    local_3f0.field_2._M_local_buf[2] = 'o';
    local_3f0.field_2._M_local_buf[3] = 'm';
    local_3f0._M_string_length = 4;
    local_3f0.field_2._M_allocated_capacity._4_4_ =
         local_3f0.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
    local_1c8 = ::vk::ProgramCollection<glu::ProgramSources>::add
                          ((ProgramCollection<glu::ProgramSources> *)local_440,&local_3f0);
    local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
    local_438.field_2._M_allocated_capacity = 0x5f74756f5f787476;
    local_438._M_string_length = 8;
    local_438.field_2._M_local_buf[8] = '\0';
    local_3d0._0_8_ = local_3d0 + 0x10;
    local_3d0._16_8_ = 0x74756f5f6d6f6567;
    local_3d0._24_2_ = 0x5f;
    local_3d0._8_8_ = 9;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"#version 310 es\n#extension GL_EXT_geometry_shader : require\n"
               ,0x3c);
    sVar2 = (shaderSpec->globalDeclarations)._M_string_length;
    if (sVar2 != 0) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(shaderSpec->globalDeclarations)._M_dataplus._M_p,
                          sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"layout(points) in;\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"layout(points, max_vertices = 1) out;\n",0x26);
    pSVar12 = (shaderSpec->inputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar12 !=
        (shaderSpec->inputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,"layout(location = ",0x12);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_1c0,iVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,") flat in ",10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_460,&local_438,&pSVar12->name);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_348,&pSVar12->varType,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,0)
        ;
        poVar8 = glu::decl::operator<<(poVar8,(DeclareVariable *)local_348);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[];\n",4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_allocated_capacity != local_320) {
          operator_delete((void *)local_330._M_allocated_capacity,
                          local_320[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_348);
        if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
          operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
        }
        iVar11 = iVar11 + 1;
        pSVar12 = pSVar12 + 1;
      } while (pSVar12 !=
               (shaderSpec->inputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pSVar12 = (shaderSpec->outputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar12 !=
        (shaderSpec->outputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar11 = 0;
      pVVar16 = &pSVar12->varType;
      do {
        pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&pVVar16[-2].m_data + 8);
        DVar5 = (pVVar16->m_data).basic.type;
        if (DVar5 - TYPE_BOOL < 4) {
          iVar4 = glu::getDataTypeScalarSize(DVar5);
          DVar5 = TYPE_INT;
          if (1 < iVar4) {
            DVar5 = glu::getDataTypeIntVec(iVar4);
          }
          glu::VarType::VarType(&local_48,DVar5,PRECISION_HIGHP);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,"layout(location = ",0x12);
          poVar8 = (ostream *)std::ostream::operator<<(local_1c0,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") flat out ",0xb);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_460,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3d0,pbVar1);
          glu::decl::DeclareVariable::DeclareVariable
                    ((DeclareVariable *)local_348,&local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                     0);
          poVar8 = glu::decl::operator<<(poVar8,(DeclareVariable *)local_348);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_allocated_capacity != local_320) {
            operator_delete((void *)local_330._M_allocated_capacity,
                            local_320[0]._M_allocated_capacity + 1);
          }
          glu::VarType::~VarType((VarType *)local_348);
          if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
            operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
          }
          glu::VarType::~VarType(&local_48);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,"layout(location = ",0x12);
          poVar8 = (ostream *)std::ostream::operator<<(local_1c0,iVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,") flat out ",0xb);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_460,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_3d0,pbVar1);
          glu::decl::DeclareVariable::DeclareVariable
                    ((DeclareVariable *)local_348,pVVar16,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460,
                     0);
          poVar8 = glu::decl::operator<<(poVar8,(DeclareVariable *)local_348);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_allocated_capacity != local_320) {
            operator_delete((void *)local_330._M_allocated_capacity,
                            local_320[0]._M_allocated_capacity + 1);
          }
          glu::VarType::~VarType((VarType *)local_348);
          if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
            operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
          }
        }
        iVar11 = iVar11 + 1;
        pSVar12 = (pointer)(pVVar16 + 1);
        pVVar16 = (VarType *)&pVVar16[2].m_data;
      } while (pSVar12 !=
               (shaderSpec->outputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"\tgl_Position = gl_in[0].gl_Position;\n\n",0x26);
    pSVar12 = (shaderSpec->inputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar12 !=
        (shaderSpec->inputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_348,&pSVar12->varType,&pSVar12->name,0);
        poVar8 = glu::decl::operator<<((ostream *)local_1c0,(DeclareVariable *)local_348);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_438._M_dataplus._M_p,local_438._M_string_length);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(pSVar12->name)._M_dataplus._M_p,(pSVar12->name)._M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[0];\n",5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_allocated_capacity != local_320) {
          operator_delete((void *)local_330._M_allocated_capacity,
                          local_320[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_348);
        pSVar12 = pSVar12 + 1;
      } while (pSVar12 !=
               (shaderSpec->inputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    pSVar12 = (shaderSpec->outputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar12 !=
        (shaderSpec->outputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
        glu::decl::DeclareVariable::DeclareVariable
                  ((DeclareVariable *)local_348,&pSVar12->varType,&pSVar12->name,0);
        poVar8 = glu::decl::operator<<((ostream *)local_1c0,(DeclareVariable *)local_348);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_allocated_capacity != local_320) {
          operator_delete((void *)local_330._M_allocated_capacity,
                          local_320[0]._M_allocated_capacity + 1);
        }
        glu::VarType::~VarType((VarType *)local_348);
        pSVar12 = pSVar12 + 1;
      } while (pSVar12 !=
               (shaderSpec->outputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\n",1);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_348,(string *)&shaderSpec->source,_S_in);
    local_460._0_8_ = local_460 + 0x10;
    local_460._8_8_ = 0;
    local_460._16_8_ = local_460._16_8_ & 0xffffffffffffff00;
    while( true ) {
      cVar3 = std::ios::widen((char)*(undefined8 *)(local_348._0_8_ - 0x18) +
                              (char)(istringstream *)local_348);
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_348,(string *)local_460,cVar3);
      if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) break;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c0,(char *)local_460._0_8_,local_460._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    }
    if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
      operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_348);
    std::ios_base::~ios_base(local_2d0);
    pSVar12 = (shaderSpec->outputs).
              super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pSVar12 !=
        (shaderSpec->outputs).
        super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        DVar5 = (pSVar12->varType).m_data.basic.type;
        if (DVar5 - TYPE_BOOL < 4) {
          iVar11 = glu::getDataTypeScalarSize(DVar5);
          DVar5 = TYPE_INT;
          if (1 < iVar11) {
            DVar5 = glu::getDataTypeIntVec(iVar11);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1c0,(char *)local_3d0._0_8_,local_3d0._8_8_);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(pSVar12->name)._M_dataplus._M_p,
                              (pSVar12->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
          pcVar9 = glu::getDataTypeName(DVar5);
          if (pcVar9 == (char *)0x0) {
            std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
          }
          else {
            sVar10 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(",1);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(pSVar12->name)._M_dataplus._M_p,
                              (pSVar12->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,");\n",3);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\t",1);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1c0,(char *)local_3d0._0_8_,local_3d0._8_8_);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(pSVar12->name)._M_dataplus._M_p,
                              (pSVar12->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," = ",3);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(pSVar12->name)._M_dataplus._M_p,
                              (pSVar12->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,";\n",2);
        }
        pSVar12 = pSVar12 + 1;
      } while (pSVar12 !=
               (shaderSpec->outputs).
               super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"\tEmitVertex();\n",0xf)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,"\tEndPrimitive();\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c0);
    std::ios_base::~ios_base(local_150);
    local_418._0_4_ = 2;
    local_418._8_8_ = local_408._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_418 + 8),local_368,local_360 + (long)local_368);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_1c8->sources + (uint)local_418._0_4_,(value_type *)(local_418 + 8));
    if ((char *)local_418._8_8_ != local_408._M_local_buf + 8) {
      operator_delete((void *)local_418._8_8_,local_408._8_8_ + 1);
    }
    if (local_368 != local_358) {
      operator_delete(local_368,local_358[0] + 1);
    }
    if ((undefined1 *)local_3d0._0_8_ != local_3d0 + 0x10) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_dataplus._M_p != &local_438.field_2) {
      operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,
                      CONCAT44(local_3f0.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_3f0.field_2._M_local_buf[3],
                                        CONCAT12(local_3f0.field_2._M_local_buf[2],
                                                 local_3f0.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    local_1c0._0_8_ = local_1b0;
    local_1b0[0]._M_allocated_capacity._0_4_ = 0x67617266;
    local_1c0._8_8_ = (char *)0x4;
    local_1b0[0]._M_allocated_capacity._4_4_ = local_1b0[0]._M_allocated_capacity._4_4_ & 0xffffff00
    ;
    pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_1c0);
    local_460._0_8_ = local_460 + 0x10;
    local_460._16_8_ = 0x74756f5f6d6f6567;
    local_460._24_2_ = 0x5f;
    local_460._8_8_ = 9;
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    local_3f0.field_2._M_allocated_capacity._0_2_ = 0x5f6f;
    local_3f0._M_string_length = 2;
    local_3f0.field_2._M_local_buf[2] = '\0';
    anon_unknown_0::generatePassthroughFragmentShader
              ((string *)local_418,shaderSpec,SUB81(&local_398,0),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *)local_460,&local_3f0,in_R9);
    local_348._0_4_ = 1;
    local_348._8_8_ = &local_330;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_348 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar7->sources + (local_348._0_8_ & 0xffffffff),(value_type *)(local_348 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._8_8_ != &local_330) {
      operator_delete((void *)local_348._8_8_,(ulong)(local_330._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,
                      CONCAT44(local_3f0.field_2._M_allocated_capacity._4_4_,
                               CONCAT13(local_3f0.field_2._M_local_buf[3],
                                        CONCAT12(local_3f0.field_2._M_local_buf[2],
                                                 local_3f0.field_2._M_allocated_capacity._0_2_))) +
                      1);
    }
    if ((undefined1 *)local_460._0_8_ != local_460 + 0x10) {
      operator_delete((void *)local_460._0_8_,local_460._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != local_1b0) goto LAB_008278d2;
    break;
  case SHADERTYPE_TESSELLATION_CONTROL:
    local_1b0[0]._M_allocated_capacity._0_4_ = 0x74726576;
    local_1c0._8_8_ = 4;
    local_1b0[0]._M_allocated_capacity._4_4_ = (uint)(uint3)local_1b0[0]._5_3_ << 8;
    local_1c0._0_8_ = local_1b0;
    pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&dst->glslSources,(string *)local_1c0);
    (anonymous_namespace)::generateVertexShaderForTess_abi_cxx11_();
    local_348._0_8_ = (ulong)(uint)local_348._4_4_ << 0x20;
    local_348._8_8_ = &local_330;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_348 + 8),local_3b0._0_8_,
               (pointer)(local_3b0._8_8_ + local_3b0._0_8_));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar7->sources + (local_348._0_8_ & 0xffffffff),(value_type *)(local_348 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._8_8_ != &local_330) {
      operator_delete((void *)local_348._8_8_,(ulong)(local_330._M_allocated_capacity + 1));
    }
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_3b0 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._0_8_ != paVar15) {
      operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != local_1b0) {
      operator_delete((void *)local_1c0._0_8_,
                      CONCAT44(local_1b0[0]._M_allocated_capacity._4_4_,
                               (undefined4)local_1b0[0]._M_allocated_capacity) + 1);
    }
    local_3b0._16_8_ = (pointer)0x6e6f635f73736574;
    local_398._M_impl._0_4_ = 0x6c6f7274;
    local_3b0._8_8_ = (pointer)0xc;
    local_398._M_impl._4_1_ = '\0';
    local_3b0._0_8_ = paVar15;
    pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_3b0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,
               "#version 310 es\n#extension GL_EXT_tessellation_shader : require\n\n",0x41);
    sVar2 = (shaderSpec->globalDeclarations)._M_string_length;
    if (sVar2 != 0) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_348,(shaderSpec->globalDeclarations)._M_dataplus._M_p,
                          sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,"\nlayout(vertices = 1) out;\n\n",0x1c);
    anon_unknown_0::BufferIoExecutor::declareBufferBlocks((ostream *)local_348,shaderSpec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,"void main (void)\n{\n",0x13);
    iVar11 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_348,"\tgl_TessLevelInner[",0x13);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_348,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = 1.0;\n",9);
      iVar11 = iVar11 + 1;
    } while (iVar11 == 1);
    iVar11 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_348,"\tgl_TessLevelOuter[",0x13);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_348,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = 1.0;\n",9);
      iVar11 = iVar11 + 1;
    } while (iVar11 != 4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,"\thighp uint invocationId = uint(gl_PrimitiveID);\n",0x31);
    anon_unknown_0::BufferIoExecutor::generateExecBufferIo
              ((ostream *)local_348,shaderSpec,"invocationId");
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
    std::ios_base::~ios_base(local_2d8);
    local_1c0._0_4_ = 3;
    pcVar9 = local_1b0[0]._M_local_buf + 8;
    local_1c0._8_8_ = pcVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1c0 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar7->sources + (local_1c0._0_8_ & 0xffffffff),(value_type *)(local_1c0 + 8));
    if ((char *)local_1c0._8_8_ != pcVar9) {
      operator_delete((void *)local_1c0._8_8_,local_1b0[0]._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._0_8_ != paVar15) {
      operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
    }
    local_3b0._16_8_ = (pointer)0x6176655f73736574;
    local_398._M_impl._0_2_ = 0x6c;
    local_3b0._8_8_ = (pointer)0x9;
    local_3b0._0_8_ = paVar15;
    pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_3b0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,
               "#version 310 es\n#extension GL_EXT_tessellation_shader : require\n\n",0x41);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,"layout(triangles, ccw) in;\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,"\nvoid main (void)\n{\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,"\tgl_Position = vec4(gl_TessCoord.xy, 0.0, 1.0);\n",0x30);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
    std::ios_base::~ios_base(local_2d8);
    local_1c0._0_4_ = 4;
    local_1c0._8_8_ = pcVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1c0 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar7->sources + (local_1c0._0_8_ & 0xffffffff),(value_type *)(local_1c0 + 8));
    if ((char *)local_1c0._8_8_ != pcVar9) {
      operator_delete((void *)local_1c0._8_8_,local_1b0[0]._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._0_8_ != paVar15) {
      operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
    }
    local_1b0[0]._M_allocated_capacity._0_4_ = 0x67617266;
    local_1c0._8_8_ = (char *)0x4;
    local_1b0[0]._M_allocated_capacity._4_4_ = local_1b0[0]._M_allocated_capacity._4_4_ & 0xffffff00
    ;
    local_1c0._0_8_ = local_1b0;
    pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_1c0);
    (anonymous_namespace)::generateEmptyFragmentSource_abi_cxx11_();
    local_348._0_4_ = 1;
    local_348._8_8_ = &local_330;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_348 + 8),local_3b0._0_8_,
               (pointer)(local_3b0._8_8_ + local_3b0._0_8_));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar7->sources + (local_348._0_8_ & 0xffffffff),(value_type *)(local_348 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._8_8_ != &local_330) {
      operator_delete((void *)local_348._8_8_,(ulong)(local_330._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._0_8_ != paVar15) {
      operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ == local_1b0) {
      return;
    }
    goto LAB_00826afe;
  case SHADERTYPE_TESSELLATION_EVALUATION:
    local_1c0._0_8_ = local_1b0;
    local_1b0[0]._M_allocated_capacity._0_4_ = 0x74726576;
    local_1c0._8_8_ = 4;
    local_1b0[0]._M_allocated_capacity._4_4_ = (uint)(uint3)local_1b0[0]._5_3_ << 8;
    pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&dst->glslSources,(string *)local_1c0);
    (anonymous_namespace)::generateVertexShaderForTess_abi_cxx11_();
    local_348._0_8_ = (ulong)(uint)local_348._4_4_ << 0x20;
    local_348._8_8_ = &local_330;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_348 + 8),local_3b0._0_8_,
               (pointer)(local_3b0._8_8_ + local_3b0._0_8_));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar7->sources + (local_348._0_8_ & 0xffffffff),(value_type *)(local_348 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._8_8_ != &local_330) {
      operator_delete((void *)local_348._8_8_,(ulong)(local_330._M_allocated_capacity + 1));
    }
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_3b0 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._0_8_ != paVar15) {
      operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != local_1b0) {
      operator_delete((void *)local_1c0._0_8_,
                      CONCAT44(local_1b0[0]._M_allocated_capacity._4_4_,
                               (undefined4)local_1b0[0]._M_allocated_capacity) + 1);
    }
    local_3b0._16_8_ = (pointer)0x6e6f635f73736574;
    local_398._M_impl._0_4_ = 0x6c6f7274;
    local_3b0._8_8_ = (pointer)0xc;
    local_398._M_impl._4_1_ = '\0';
    local_3b0._0_8_ = paVar15;
    pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_3b0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,
               "#version 310 es\n#extension GL_EXT_tessellation_shader : require\n\n",0x41);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,"layout(vertices = 1) out;\n\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,"void main (void)\n{\n",0x13);
    iVar11 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_348,"\tgl_TessLevelInner[",0x13);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_348,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = 1.0;\n",9);
      iVar11 = iVar11 + 1;
    } while (iVar11 == 1);
    iVar11 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_348,"\tgl_TessLevelOuter[",0x13);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)local_348,iVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = 1.0;\n",9);
      iVar11 = iVar11 + 1;
    } while (iVar11 != 4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
    std::ios_base::~ios_base(local_2d8);
    local_1c0._0_4_ = 3;
    pcVar9 = local_1b0[0]._M_local_buf + 8;
    local_1c0._8_8_ = pcVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1c0 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar7->sources + (local_1c0._0_8_ & 0xffffffff),(value_type *)(local_1c0 + 8));
    if ((char *)local_1c0._8_8_ != pcVar9) {
      operator_delete((void *)local_1c0._8_8_,local_1b0[0]._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._0_8_ != paVar15) {
      operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
    }
    local_3b0._16_8_ = (pointer)0x6176655f73736574;
    local_398._M_impl._0_2_ = 0x6c;
    local_3b0._8_8_ = (pointer)0x9;
    local_3b0._0_8_ = paVar15;
    pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_3b0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,
               "#version 310 es\n#extension GL_EXT_tessellation_shader : require\n\n",0x41);
    sVar2 = (shaderSpec->globalDeclarations)._M_string_length;
    if (sVar2 != 0) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_348,(shaderSpec->globalDeclarations)._M_dataplus._M_p,
                          sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,"layout(isolines, equal_spacing) in;\n\n",0x25);
    anon_unknown_0::BufferIoExecutor::declareBufferBlocks((ostream *)local_348,shaderSpec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,"void main (void)\n{\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,"\tgl_Position = vec4(gl_TessCoord.x, 0.0, 0.0, 1.0);\n",0x34);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,
               "\thighp uint invocationId = uint(gl_PrimitiveID)*2u + (gl_TessCoord.x > 0.5 ? 1u : 0u);\n"
               ,0x57);
    anon_unknown_0::BufferIoExecutor::generateExecBufferIo
              ((ostream *)local_348,shaderSpec,"invocationId");
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
    std::ios_base::~ios_base(local_2d8);
    local_1c0._0_4_ = 4;
    local_1c0._8_8_ = pcVar9;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1c0 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar7->sources + (local_1c0._0_8_ & 0xffffffff),(value_type *)(local_1c0 + 8));
    if ((char *)local_1c0._8_8_ != pcVar9) {
      operator_delete((void *)local_1c0._8_8_,local_1b0[0]._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._0_8_ != paVar15) {
      operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
    }
    local_1c0._0_8_ = local_1b0;
    local_1b0[0]._M_allocated_capacity._0_4_ = 0x67617266;
    local_1c0._8_8_ = (char *)0x4;
    local_1b0[0]._M_allocated_capacity._4_4_ = local_1b0[0]._M_allocated_capacity._4_4_ & 0xffffff00
    ;
    pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       ((ProgramCollection<glu::ProgramSources> *)local_440,(string *)local_1c0);
    (anonymous_namespace)::generateEmptyFragmentSource_abi_cxx11_();
    local_348._0_4_ = 1;
    local_348._8_8_ = &local_330;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_348 + 8),local_3b0._0_8_,
               (pointer)(local_3b0._8_8_ + local_3b0._0_8_));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar7->sources + (local_348._0_8_ & 0xffffffff),(value_type *)(local_348 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._8_8_ != &local_330) {
      operator_delete((void *)local_348._8_8_,(ulong)(local_330._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._0_8_ != paVar15) {
      operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ == local_1b0) {
      return;
    }
LAB_00826afe:
    ppSVar13 = (pointer)CONCAT44(local_1b0[0]._M_allocated_capacity._4_4_,
                                 (undefined4)local_1b0[0]._M_allocated_capacity);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._0_8_;
LAB_00827284:
    uVar14 = (long)ppSVar13 + 1;
    goto LAB_00827902;
  case SHADERTYPE_COMPUTE:
    local_3b0._8_8_ = (pointer)0x7;
    local_3b0._16_8_ = (pointer)0x657475706d6f63;
    local_3b0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_3b0 + 0x10);
    pPVar7 = ::vk::ProgramCollection<glu::ProgramSources>::add
                       (&dst->glslSources,(string *)local_3b0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,"#version 310 es\n",0x10);
    sVar2 = (shaderSpec->globalDeclarations)._M_string_length;
    if (sVar2 != 0) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_348,(shaderSpec->globalDeclarations)._M_dataplus._M_p,
                          sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,"layout(local_size_x = 1) in;\n",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"\n",1);
    anon_unknown_0::BufferIoExecutor::declareBufferBlocks((ostream *)local_348,shaderSpec);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,
               "\tuint invocationNdx = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z\n",
               0x4d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_348,
               "\t                   + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n",
               0x4e);
    anon_unknown_0::BufferIoExecutor::generateExecBufferIo
              ((ostream *)local_348,shaderSpec,"invocationNdx");
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_348,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
    std::ios_base::~ios_base(local_2d8);
    local_1c0._0_4_ = 5;
    local_1c0._8_8_ = local_1b0[0]._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1c0 + 8),CONCAT44(local_418._4_4_,local_418._0_4_),
               (char *)(local_418._8_8_ + CONCAT44(local_418._4_4_,local_418._0_4_)));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(pPVar7->sources + (local_1c0._0_8_ & 0xffffffff),(value_type *)(local_1c0 + 8));
    if ((char *)local_1c0._8_8_ != local_1b0[0]._M_local_buf + 8) {
      operator_delete((void *)local_1c0._8_8_,local_1b0[0]._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_418._4_4_,local_418._0_4_) != &local_408) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_418._4_4_,local_418._0_4_),
                      local_408._M_allocated_capacity + 1);
    }
    ppSVar13 = (pointer)local_3b0._16_8_;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_3b0 + 0x10)) {
      return;
    }
    goto LAB_00827284;
  default:
    this = (InternalError *)__cxa_allocate_exception(0x38);
    tcu::InternalError::InternalError
              (this,"Unsupported shader type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktShaderExecutor.cpp"
               ,0xb2b);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_398);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    uVar14 = local_3b0._16_8_ - local_3b0._0_8_;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._0_8_;
LAB_00827902:
    operator_delete(paVar15,uVar14);
  }
  return;
}

Assistant:

void generateSources (glu::ShaderType shaderType, const ShaderSpec& shaderSpec, vk::SourceCollections& dst)
{
	switch (shaderType)
	{
		case glu::SHADERTYPE_VERTEX:					VertexShaderExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_TESSELLATION_CONTROL:		TessControlExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_TESSELLATION_EVALUATION:	TessEvaluationExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_GEOMETRY:					GeometryShaderExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_FRAGMENT:					FragmentShaderExecutor::generateSources	(shaderSpec, dst);	break;
		case glu::SHADERTYPE_COMPUTE:					ComputeShaderExecutor::generateSources	(shaderSpec, dst);	break;
		default:
			TCU_THROW(InternalError, "Unsupported shader type");
	}
}